

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_csv_2of3_then_2_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  size_t sVar1;
  ulong uVar2;
  uchar *puVar3;
  size_t script_len;
  size_t csv_len;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t csv_blocks_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  sVar1 = scriptint_get_length((ulong)csv_blocks);
  uVar2 = sVar1 + 0x74;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((bytes == (uchar *)0x0) || (bytes_len != 99)) || (csv_blocks < 0x11)) ||
     (((0xffff < csv_blocks || (flags != 0)) ||
      ((bytes_out == (uchar *)0x0 || (written == (size_t *)0x0)))))) {
    bytes_local._4_4_ = -2;
  }
  else if (len < uVar2) {
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  else {
    *bytes_out = 't';
    bytes_out[1] = 0x8c;
    bytes_out[2] = 0x8c;
    bytes_out[3] = 'c';
    bytes_out[4] = 'R';
    bytes_out[5] = '!';
    memcpy(bytes_out + 6,bytes,0x21);
    bytes_out[0x27] = 'g';
    bytes_out[0x28] = (uchar)sVar1;
    sVar1 = scriptint_to_bytes((ulong)csv_blocks,bytes_out + 0x29);
    puVar3 = bytes_out + 0x29 + sVar1;
    *puVar3 = 0xb2;
    puVar3[1] = 'u';
    puVar3[2] = 'Q';
    puVar3[3] = '\0';
    puVar3[4] = 'h';
    puVar3[5] = '!';
    memcpy(puVar3 + 6,bytes + 0x21,0x21);
    puVar3[0x27] = '!';
    memcpy(puVar3 + 0x28,bytes + 0x42,0x21);
    puVar3[0x49] = 'S';
    puVar3[0x4a] = 0xae;
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_csv_2of3_then_2_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 3 * (EC_PUBLIC_KEY_LEN + 1) + 13 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 3 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     OP_DEPTH OP_1SUB OP_1SUB
     *     OP_IF
     *       # The stack contains 3 items, a dummy push for the off-by-one bug
     *       # in OP_CHECKMULTISIG, and any 2 of the 3 signatures.
     *       OP_2 <main_pubkey>
     *     OP_ELSE
     *       # The stack contains a dummy push as above, and either of the
     *       # recovery signatures.
     *       <csv_blocks> OP_CHECKSEQUENCEVERIFY OP_DROP
     *       # Note OP_0 is a dummy pubkey that can't match any signature. This
     *       # allows us to share the final OP_3 OP_CHECKMULTISIGVERIFY case
     *       # thus reducing the size of the script.
     *       OP_1 OP_0
     *     OP_ENDIF
     *     # Shared code to check the signatures provided
     *     <recovery_pubkey> <recovery_pubkey_2> OP_3 OP_CHECKMULTISIG
     */
    *bytes_out++ = OP_DEPTH;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_IF;
    *bytes_out++ = OP_2;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_ELSE;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_DROP;
    *bytes_out++ = OP_1;
    *bytes_out++ = OP_0;
    *bytes_out++ = OP_ENDIF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN * 2, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_3;
    *bytes_out++ = OP_CHECKMULTISIG;

    *written = script_len;
    return WALLY_OK;
}